

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Value::resize(Value *this,ArrayIndex newSize)

{
  ushort uVar1;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  ArrayIndex AVar2;
  char *pcVar3;
  key_type *this_01;
  anon_union_4_2_4572b0f8_for_CZString_1 aVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::_Rb_tree_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  pVar5;
  ostringstream oss;
  string local_1f0;
  key_type local_1d0 [23];
  ValueHolder local_58;
  ushort local_50;
  CommentInfo *local_48;
  size_t local_40;
  size_t sStack_38;
  
  this_01 = (key_type *)(ulong)newSize;
  uVar1 = *(ushort *)&this->field_0x8;
  if ((char)uVar1 != '\0') {
    if ((char)uVar1 == '\x06') goto LAB_00111209;
    this_01 = local_1d0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"in Json::Value::resize(): requires arrayValue",0x2d);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1f0);
  }
  newSize = (ArrayIndex)this_01;
  pcVar3 = (char *)operator_new(0x30);
  pcVar3[0x10] = '\0';
  pcVar3[0x11] = '\0';
  pcVar3[0x12] = '\0';
  pcVar3[0x13] = '\0';
  pcVar3[0x14] = '\0';
  pcVar3[0x15] = '\0';
  pcVar3[0x16] = '\0';
  pcVar3[0x17] = '\0';
  pcVar3[0x18] = '\0';
  pcVar3[0x19] = '\0';
  pcVar3[0x1a] = '\0';
  pcVar3[0x1b] = '\0';
  pcVar3[0x1c] = '\0';
  pcVar3[0x1d] = '\0';
  pcVar3[0x1e] = '\0';
  pcVar3[0x1f] = '\0';
  pcVar3[0] = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  pcVar3[8] = '\0';
  pcVar3[9] = '\0';
  pcVar3[10] = '\0';
  pcVar3[0xb] = '\0';
  pcVar3[0xc] = '\0';
  pcVar3[0xd] = '\0';
  pcVar3[0xe] = '\0';
  pcVar3[0xf] = '\0';
  *(char **)(pcVar3 + 0x18) = pcVar3 + 8;
  *(char **)(pcVar3 + 0x20) = pcVar3 + 8;
  pcVar3[0x28] = '\0';
  pcVar3[0x29] = '\0';
  pcVar3[0x2a] = '\0';
  pcVar3[0x2b] = '\0';
  pcVar3[0x2c] = '\0';
  pcVar3[0x2d] = '\0';
  pcVar3[0x2e] = '\0';
  pcVar3[0x2f] = '\0';
  local_58 = this->value_;
  (this->value_).string_ = pcVar3;
  *(ushort *)&this->field_0x8 = uVar1 & 0xfe00 | 6;
  local_50 = uVar1 & 0x1ff;
  local_48 = this->comments_;
  this->comments_ = (CommentInfo *)0x0;
  local_40 = this->start_;
  sStack_38 = this->limit_;
  this->start_ = 0;
  this->limit_ = 0;
  ~Value((Value *)&local_58);
LAB_00111209:
  AVar2 = size(this);
  if (newSize == 0) {
    clear(this);
    return;
  }
  if (AVar2 < newSize) {
    operator[](this,newSize - 1);
    return;
  }
  if (newSize < AVar2) {
    aVar4.index_ = newSize;
    do {
      this_00 = &((this->value_).map_)->_M_t;
      local_1d0[0].cstr_ = (char *)0x0;
      local_1d0[0].field_1 = aVar4;
      pVar5 = std::
              _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
              ::equal_range(this_00,local_1d0);
      std::
      _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
      ::_M_erase_aux(this_00,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node);
      if ((local_1d0[0].cstr_ != (char *)0x0) && ((local_1d0[0].field_1.index_ & 3) == 1)) {
        free(local_1d0[0].cstr_);
      }
      aVar4.index_ = aVar4.index_ + 1;
    } while (AVar2 != aVar4.index_);
  }
  AVar2 = size(this);
  if (AVar2 == newSize) {
    return;
  }
  __assert_fail("size() == newSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/lib_json/json_value.cpp"
                ,0x394,"void Json::Value::resize(ArrayIndex)");
}

Assistant:

void Value::resize(ArrayIndex newSize) {
  JSON_ASSERT_MESSAGE(type_ == nullValue || type_ == arrayValue,
                      "in Json::Value::resize(): requires arrayValue");
  if (type_ == nullValue)
    *this = Value(arrayValue);
  ArrayIndex oldSize = size();
  if (newSize == 0)
    clear();
  else if (newSize > oldSize)
    (*this)[newSize - 1];
  else {
    for (ArrayIndex index = newSize; index < oldSize; ++index) {
      value_.map_->erase(index);
    }
    assert(size() == newSize);
  }
}